

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O3

BlockStatementPtr __thiscall VMState::PushBlock(VMState *this)

{
  enable_shared_from_this<Statement> *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  BlockStatement *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long in_RSI;
  BlockStatementPtr BVar6;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  this->m_Parent = *(NutFunction **)(in_RSI + 8);
  peVar2 = *(element_type **)(in_RSI + 0x10);
  (this->m_Block).super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  if (peVar2 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      peVar1 = &(peVar2->super_Statement).super_enable_shared_from_this<Statement>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
      UNLOCK();
    }
    else {
      peVar1 = &(peVar2->super_Statement).super_enable_shared_from_this<Statement>;
      *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(int *)&(peVar1->_M_weak_this).super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 1;
    }
  }
  __p = (BlockStatement *)operator_new(0x30);
  (__p->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
  super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__p->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
  super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->super_Statement)._vptr_Statement = (_func_int **)&PTR_GetType_0012ccb0;
  (__p->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->m_Statements).
  super__Vector_base<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<BlockStatement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<BlockStatement,void>
            ((__shared_ptr<BlockStatement,(__gnu_cxx::_Lock_policy)2> *)&local_28,__p);
  p_Var4 = p_Stack_20;
  uVar3 = local_28;
  local_28 = 0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
  *(undefined8 *)(in_RSI + 8) = uVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10) = p_Var4;
  _Var5._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var5._M_pi = extraout_RDX_00;
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
      _Var5._M_pi = extraout_RDX_01;
    }
  }
  BVar6.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  BVar6.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (BlockStatementPtr)BVar6.super___shared_ptr<BlockStatement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BlockStatementPtr PushBlock( void )
	{
		BlockStatementPtr prevBlock = m_Block;
		m_Block = BlockStatementPtr(new BlockStatement);

		return prevBlock;
	}